

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRWithLayer(float **out_rgba,int *width,int *height,char *filename,char *layername,
                    char **err)

{
  float *pfVar1;
  size_t sVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int *piVar17;
  int j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar18;
  char **ppcVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  int j_1;
  ulong uVar24;
  char **ppcVar25;
  EXRTile *pEVar26;
  pointer pcVar27;
  float fVar28;
  allocator local_389;
  char *local_388;
  char **local_380;
  EXRTile *local_378;
  char **local_370;
  int *local_368;
  int *local_360;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> channels;
  EXRImage exr_image;
  string ch_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  EXRVersion exr_version;
  EXRHeader exr_header;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream ss;
  string local_1b0 [8];
  ostream local_1a8 [376];
  
  if (out_rgba == (float **)0x0) {
    std::__cxx11::string::string
              ((string *)&ss,"Invalid argument for LoadEXR()",(allocator *)&exr_header);
    tinyexr::SetErrorMessage((string *)&ss,err);
    std::__cxx11::string::~string((string *)&ss);
    return -3;
  }
  local_368 = width;
  local_360 = height;
  memset(&exr_header,0,0x88);
  exr_image.tiles = (EXRTile *)0x0;
  exr_image.images = (uchar **)0x0;
  exr_image.width = 0;
  exr_image.height = 0;
  exr_image.num_channels = 0;
  exr_image.num_tiles = 0;
  iVar8 = ParseEXRVersionFromFile(&exr_version,filename);
  if (iVar8 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar9 = std::operator<<(local_1a8,
                             "Failed to open EXR file or read version info from EXR file. code(");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar8);
    std::operator<<(poVar9,")");
    std::__cxx11::stringbuf::str();
    tinyexr::SetErrorMessage(&ch_name,err);
    std::__cxx11::string::~string((string *)&ch_name);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return iVar8;
  }
  if (exr_version.non_image != 0 || exr_version.multipart != 0) {
    std::__cxx11::string::string
              ((string *)&ss,"Loading multipart or DeepImage is not supported  in LoadEXR() API",
               (allocator *)&ch_name);
    tinyexr::SetErrorMessage((string *)&ss,err);
    std::__cxx11::string::~string((string *)&ss);
    return -4;
  }
  iVar8 = ParseEXRHeaderFromFile(&exr_header,&exr_version,filename,err);
  if (iVar8 != 0) {
LAB_0015be81:
    FreeEXRHeader(&exr_header);
    return iVar8;
  }
  for (lVar16 = 0; lVar16 < exr_header.num_channels; lVar16 = lVar16 + 1) {
    if (exr_header.pixel_types[lVar16] == 1) {
      exr_header.requested_pixel_types[lVar16] = 2;
    }
  }
  iVar8 = LoadEXRImageFromFile(&exr_image,&exr_header,filename,err);
  if (iVar8 != 0) goto LAB_0015be81;
  layer_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  layer_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  layer_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tinyexr::GetLayers(&exr_header,&layer_names);
  channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  channels.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_388 = layername;
  local_380 = err;
  if (layername == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_2b8,"",&local_389);
  }
  else {
    std::__cxx11::string::string((string *)&local_2b8,layername,&local_389);
  }
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::clear(&channels);
  lVar16 = 0;
  for (pcVar27 = (pointer)0x0; (long)pcVar27 < (long)exr_header.num_channels; pcVar27 = pcVar27 + 1)
  {
    std::__cxx11::string::string
              ((string *)&ch_name,(exr_header.channels)->name + lVar16,(allocator *)&ss);
    if (local_2b8._M_string_length == 0) {
      uVar11 = std::__cxx11::string::rfind((char)&ch_name,0x2e);
      if ((uVar11 != 0xffffffffffffffff) && (uVar11 < ch_name._M_string_length)) {
        std::__cxx11::string::substr((ulong)&ss,(ulong)&ch_name);
LAB_0015bfea:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&ch_name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss
                  );
        std::__cxx11::string::~string((string *)&ss);
      }
LAB_0015bffd:
      std::__cxx11::string::string((string *)&local_1d8,&ch_name);
      _ss = pcVar27;
      std::__cxx11::string::string(local_1b0,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::push_back
                (&channels,(value_type *)&ss);
      std::__cxx11::string::~string(local_1b0);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &local_2b8,'.');
      lVar10 = std::__cxx11::string::find((string *)&ch_name,(ulong)&ss);
      std::__cxx11::string::~string((string *)&ss);
      if (lVar10 != -1) {
        if (lVar10 == 0) {
          std::__cxx11::string::substr((ulong)&ss,(ulong)&ch_name);
          goto LAB_0015bfea;
        }
        goto LAB_0015bffd;
      }
    }
    std::__cxx11::string::~string((string *)&ch_name);
    lVar16 = lVar16 + 0x110;
  }
  std::__cxx11::string::~string((string *)&local_2b8);
  if ((long)channels.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)channels.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    std::__cxx11::string::string((string *)&ss,"Layer Not Found",(allocator *)&ch_name);
    tinyexr::SetErrorMessage((string *)&ss,local_380);
    std::__cxx11::string::~string((string *)&ss);
    iVar8 = -0xd;
    goto LAB_0015c67a;
  }
  uVar12 = ((long)channels.
                  super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)channels.
                 super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x28;
  uVar11 = 4;
  if (uVar12 < 4) {
    uVar11 = uVar12;
  }
  iVar8 = -1;
  local_378 = (EXRTile *)CONCAT44(local_378._4_4_,0xffffffff);
  local_370 = (char **)CONCAT44(local_370._4_4_,0xffffffff);
  local_388 = (char *)CONCAT44(local_388._4_4_,0xffffffff);
  for (lVar16 = 0; ppcVar19 = local_380, uVar11 * 0x28 - lVar16 != 0; lVar16 = lVar16 + 0x28) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&((channels.
                      super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                      ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar16);
    piVar17 = (int *)((long)&(channels.
                              super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start)->index + lVar16);
    bVar7 = std::operator==(__lhs,"R");
    if (bVar7) {
      iVar8 = *piVar17;
    }
    else {
      bVar7 = std::operator==(__lhs,"G");
      if (bVar7) {
        local_370 = (char **)CONCAT44(local_370._4_4_,*piVar17);
      }
      else {
        bVar7 = std::operator==(__lhs,"B");
        if (bVar7) {
          local_378 = (EXRTile *)CONCAT44(local_378._4_4_,*piVar17);
        }
        else {
          bVar7 = std::operator==(__lhs,"A");
          if (bVar7) {
            local_388 = (char *)CONCAT44(local_388._4_4_,*piVar17);
          }
        }
      }
    }
  }
  iVar5 = exr_image.width;
  iVar6 = exr_image.height;
  if ((long)channels.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)channels.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x28) {
    sVar2 = (channels.
             super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
             _M_impl.super__Vector_impl_data._M_start)->index;
    pfVar13 = (float *)malloc((long)exr_image.width * (long)exr_image.height * 0x10);
    *out_rgba = pfVar13;
    iVar8 = (int)sVar2;
    if (exr_header.tiled == 0) {
      uVar12 = 0;
      uVar11 = (ulong)(uint)(iVar6 * iVar5);
      if (iVar6 * iVar5 < 1) {
        uVar11 = uVar12;
      }
      for (; uVar11 * 4 != uVar12; uVar12 = uVar12 + 4) {
        fVar28 = *(float *)(exr_image.images[iVar8] + uVar12);
        pfVar1 = pfVar13 + uVar12;
        *pfVar1 = fVar28;
        pfVar1[1] = fVar28;
        pfVar1[2] = fVar28;
        pfVar1[3] = fVar28;
      }
    }
    else {
      local_378 = exr_image.tiles;
      uVar11 = 0;
      if (0 < exr_header.tile_size_x) {
        uVar11 = (ulong)(uint)exr_header.tile_size_x;
      }
      local_388 = (char *)0x0;
      if (0 < exr_header.tile_size_y) {
        local_388 = (char *)(ulong)(uint)exr_header.tile_size_y;
      }
      local_370 = (char **)(ulong)(uint)exr_image.num_tiles;
      if (exr_image.num_tiles < 1) {
        local_370 = (char **)0x0;
      }
      ppcVar19 = (char **)0x0;
      while (ppcVar25 = ppcVar19, ppcVar25 != local_370) {
        pEVar26 = exr_image.tiles + (long)ppcVar25;
        lVar16 = 0;
        for (pcVar18 = (char *)0x0; pcVar18 != local_388; pcVar18 = pcVar18 + 1) {
          for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
            iVar14 = pEVar26->offset_x * exr_header.tile_size_x;
            if ((int)uVar12 + iVar14 < iVar5) {
              iVar23 = pEVar26->offset_y * exr_header.tile_size_y;
              if (iVar23 + (int)pcVar18 < iVar6) {
                iVar14 = iVar14 + (int)uVar12 + (iVar23 + (int)pcVar18) * iVar5;
                puVar3 = pEVar26->images[iVar8];
                fVar28 = *(float *)(puVar3 + uVar12 * 4 + lVar16);
                pfVar13[iVar14 * 4] = fVar28;
                pfVar13[iVar14 * 4 + 1] = fVar28;
                fVar28 = *(float *)(puVar3 + uVar12 * 4 + lVar16);
                pfVar13[iVar14 * 4 + 2] = fVar28;
                pfVar13[iVar14 * 4 + 3] = fVar28;
              }
            }
          }
          lVar16 = lVar16 + (long)exr_header.tile_size_x * 4;
        }
        local_380 = ppcVar25;
        ppcVar19 = (char **)((long)ppcVar25 + 1);
      }
    }
LAB_0015c672:
    *local_368 = iVar5;
    *local_360 = iVar6;
    iVar8 = 0;
  }
  else {
    if (iVar8 == -1) {
      std::__cxx11::string::string((string *)&ss,"R channel not found",(allocator *)&ch_name);
      ppcVar19 = local_380;
    }
    else {
      iVar14 = (int)local_370;
      if ((int)local_370 == -1) {
        std::__cxx11::string::string((string *)&ss,"G channel not found",(allocator *)&ch_name);
      }
      else {
        iVar23 = (int)local_378;
        if ((int)local_378 != -1) {
          pfVar13 = (float *)malloc((long)exr_image.width * (long)exr_image.height * 0x10);
          *out_rgba = pfVar13;
          if (exr_header.tiled == 0) {
            uVar12 = 0;
            uVar11 = (ulong)(uint)(iVar6 * iVar5);
            if (iVar6 * iVar5 < 1) {
              uVar11 = uVar12;
            }
            for (; uVar11 * 4 != uVar12; uVar12 = uVar12 + 4) {
              pfVar13[uVar12] = *(float *)(exr_image.images[iVar8] + uVar12);
              pfVar13[uVar12 + 1] = *(float *)(exr_image.images[iVar14] + uVar12);
              pfVar13[uVar12 + 2] = *(float *)(exr_image.images[iVar23] + uVar12);
              fVar28 = 1.0;
              if ((int)local_388 != -1) {
                fVar28 = *(float *)(exr_image.images[(int)local_388] + uVar12);
              }
              pfVar13[uVar12 + 3] = fVar28;
            }
          }
          else {
            local_380 = (char **)(long)iVar8;
            local_370 = (char **)(long)iVar14;
            uVar12 = 0;
            uVar11 = 0;
            if (0 < exr_header.tile_size_x) {
              uVar11 = (ulong)(uint)exr_header.tile_size_x;
            }
            uVar20 = 0;
            if (0 < exr_header.tile_size_y) {
              uVar20 = (ulong)(uint)exr_header.tile_size_y;
            }
            uVar15 = (ulong)(uint)exr_image.num_tiles;
            if (exr_image.num_tiles < 1) {
              uVar15 = uVar12;
            }
            local_378 = (EXRTile *)(long)(int)local_388;
            for (; uVar12 != uVar15; uVar12 = uVar12 + 1) {
              pEVar26 = exr_image.tiles + uVar12;
              lVar16 = 0;
              for (uVar24 = 0; uVar24 != uVar20; uVar24 = uVar24 + 1) {
                iVar8 = 0;
                lVar10 = lVar16;
                uVar21 = uVar11;
                while (bVar7 = uVar21 != 0, uVar21 = uVar21 - 1, bVar7) {
                  iVar14 = pEVar26->offset_x * exr_header.tile_size_x + iVar8;
                  if (iVar14 < iVar5) {
                    iVar22 = pEVar26->offset_y * exr_header.tile_size_y;
                    if (iVar22 + (int)uVar24 < iVar6) {
                      iVar14 = iVar14 + (iVar22 + (int)uVar24) * iVar5;
                      ppuVar4 = pEVar26->images;
                      pfVar13[iVar14 * 4] = *(float *)(ppuVar4[(long)local_380] + lVar10);
                      pfVar13[iVar14 * 4 + 1] = *(float *)(ppuVar4[(long)local_370] + lVar10);
                      pfVar13[iVar14 * 4 + 2] = *(float *)(ppuVar4[iVar23] + lVar10);
                      fVar28 = 1.0;
                      if ((int)local_388 != -1) {
                        fVar28 = *(float *)(ppuVar4[(long)local_378] + lVar10);
                      }
                      pfVar13[(int)(iVar14 * 4 | 3)] = fVar28;
                    }
                  }
                  iVar8 = iVar8 + 1;
                  lVar10 = lVar10 + 4;
                }
                lVar16 = lVar16 + (long)exr_header.tile_size_x * 4;
              }
            }
          }
          goto LAB_0015c672;
        }
        std::__cxx11::string::string((string *)&ss,"B channel not found",(allocator *)&ch_name);
      }
    }
    tinyexr::SetErrorMessage((string *)&ss,ppcVar19);
    std::__cxx11::string::~string((string *)&ss);
    iVar8 = -4;
  }
LAB_0015c67a:
  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::~vector(&channels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&layer_names);
  return iVar8;
}

Assistant:

int LoadEXRWithLayer(float **out_rgba, int *width, int *height,
                     const char *filename, const char *layername,
                     const char **err) {
  if (out_rgba == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXR()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      std::stringstream ss;
      ss << "Failed to open EXR file or read version info from EXR file. code("
         << ret << ")";
      tinyexr::SetErrorMessage(ss.str(), err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  // TODO: Probably limit loading to layers (channels) selected by layer index
  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;

  std::vector<std::string> layer_names;
  tinyexr::GetLayers(exr_header, layer_names);

  std::vector<tinyexr::LayerChannel> channels;
  tinyexr::ChannelsInLayer(
      exr_header, layername == NULL ? "" : std::string(layername), channels);

  if (channels.size() < 1) {
    tinyexr::SetErrorMessage("Layer Not Found", err);
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    return TINYEXR_ERROR_LAYER_NOT_FOUND;
  }

  size_t ch_count = channels.size() < 4 ? channels.size() : 4;
  for (size_t c = 0; c < ch_count; c++) {
    const tinyexr::LayerChannel &ch = channels[c];

    if (ch.name == "R") {
      idxR = int(ch.index);
    } else if (ch.name == "G") {
      idxG = int(ch.index);
    } else if (ch.name == "B") {
      idxB = int(ch.index);
    } else if (ch.name == "A") {
      idxA = int(ch.index);
    }
  }

  if (channels.size() == 1) {
    int chIdx = int(channels.front().index);
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii = exr_image.tiles[it].offset_x *
                               static_cast<int>(exr_header.tile_size_x) +
                           i;
            const int jj = exr_image.tiles[it].offset_y *
                               static_cast<int>(exr_header.tile_size_y) +
                           j;
            const int idx = ii + jj * static_cast<int>(exr_image.width);

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        const float val =
            reinterpret_cast<float **>(exr_image.images)[chIdx][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }
  } else {
    // Assume RGB(A)

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));
    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}